

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::UniformCase::generateFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms)

{
  CaseShaderType CVar1;
  uint uVar2;
  UniformCase *this_00;
  ostringstream result;
  undefined1 local_1a0 [376];
  
  CVar1 = this->m_caseShaderType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"#version 310 es\nin mediump float v_vtxOut;\n\n",0x2c);
  uVar2 = CVar1 - CASESHADERTYPE_FRAGMENT;
  if (uVar2 < 2) {
    writeUniformDefinitions(this,(ostringstream *)local_1a0);
  }
  this_00 = (UniformCase *)local_1a0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\n\nvoid main (void)\n{\n\tmediump float result = v_vtxOut;\n"
             ,0x6d);
  if (uVar2 < 2) {
    writeUniformComparisons(this_00,(ostringstream *)local_1a0,basicUniforms,"result");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\tdEQP_FragColor = vec4(1.0-result, result, 0.0, 1.0);\n}\n",0x38
            );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string UniformCase::generateFragmentSource (const vector<BasicUniform>& basicUniforms) const
{
	const bool			isFragmentCase = m_caseShaderType == CASESHADERTYPE_FRAGMENT || m_caseShaderType == CASESHADERTYPE_BOTH;
	std::ostringstream	result;

	result << "#version 310 es\n"
			  "in mediump float v_vtxOut;\n"
			  "\n";

	if (isFragmentCase)
		writeUniformDefinitions(result);

	result << "\n"
			  "layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
			  "\n"
			  "void main (void)\n"
			  "{\n"
			  "	mediump float result = v_vtxOut;\n";

	if (isFragmentCase)
		writeUniformComparisons(result, basicUniforms, "result");

	result << "	dEQP_FragColor = vec4(1.0-result, result, 0.0, 1.0);\n"
			  "}\n";

	return result.str();
}